

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void CountTracks(Node *node,uint *cnt)

{
  pointer ppNVar1;
  uint uVar2;
  
  if ((((1 < (ulong)(((long)(node->aPositionKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(node->aPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x18)) ||
       (1 < (ulong)(((long)(node->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(node->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18))) ||
      (1 < (ulong)(((long)(node->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(node->aScalingKeys).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18))) ||
     ((0x10 < (ulong)((long)(node->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(node->aCameraRollKeys).
                           super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                           ._M_impl.super__Vector_impl_data._M_start) ||
      (1 < (ulong)(((long)(node->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(node->aTargetPositionKeys).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18))))) {
    uVar2 = *cnt;
    *cnt = uVar2 + 1;
    if (1 < (ulong)(((long)(node->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(node->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18)) {
      *cnt = uVar2 + 2;
    }
  }
  uVar2 = 0;
  while( true ) {
    ppNVar1 = (node->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(node->mChildren).
                      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <=
        (ulong)uVar2) break;
    CountTracks(ppNVar1[uVar2],cnt);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void CountTracks(D3DS::Node* node, unsigned int& cnt)
{
    //////////////////////////////////////////////////////////////////////////////
    // We will never generate more than one channel for a node, so
    // this is rather easy here.

    if (node->aPositionKeys.size()  > 1  || node->aRotationKeys.size()   > 1   ||
        node->aScalingKeys.size()   > 1  || node->aCameraRollKeys.size() > 1 ||
        node->aTargetPositionKeys.size()  > 1)
    {
        ++cnt;

        // account for the additional channel for the camera/spotlight target position
        if (node->aTargetPositionKeys.size()  > 1)++cnt;
    }

    // Recursively process all children
    for (unsigned int i = 0; i < node->mChildren.size();++i)
        CountTracks(node->mChildren[i],cnt);
}